

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::openWebSocket
          (NetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  RefcountedClient *pRVar1;
  HttpClientImpl *pHVar2;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t> *other;
  StringPtr url_00;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  local_78;
  size_t local_68;
  HttpHeaders *pHStack_60;
  undefined1 local_48 [8];
  Promise<kj::HttpClient::WebSocketResponse> result;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  HttpHeaders *headers_local;
  NetworkAddressHttpClient *this_local;
  StringPtr url_local;
  
  url_00.content.size_ = url.content.size_;
  getClient((NetworkAddressHttpClient *)&result);
  pRVar1 = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
           ::operator->((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                         *)&result);
  pHVar2 = Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::operator->
                     (&pRVar1->client);
  url_00.content.ptr = (char *)pHVar2;
  local_68 = url_00.content.size_;
  pHStack_60 = headers;
  HttpClientImpl::openWebSocket((HttpClientImpl *)local_48,url_00,headers);
  other = mv<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
                    ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                      *)&result);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::Own
            (&local_78,other);
  Promise<kj::HttpClient::WebSocketResponse>::
  then<kj::(anonymous_namespace)::NetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_>
            ((Promise<kj::HttpClient::WebSocketResponse> *)this,(Type *)local_48);
  (anonymous_namespace)::NetworkAddressHttpClient::
  openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::
  {lambda(kj::HttpClient::WebSocketResponse&&)#1}::~WebSocketResponse
            ((_lambda_kj__HttpClient__WebSocketResponse____1_ *)&local_78);
  Promise<kj::HttpClient::WebSocketResponse>::~Promise
            ((Promise<kj::HttpClient::WebSocketResponse> *)local_48);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&result);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    auto refcounted = getClient();
    auto result = refcounted->client->openWebSocket(url, headers);
    return result.then(
        [refcounted=kj::mv(refcounted)](WebSocketResponse&& response) mutable {
      KJ_SWITCH_ONEOF(response.webSocketOrBody) {
        KJ_CASE_ONEOF(body, kj::Own<kj::AsyncInputStream>) {
          response.webSocketOrBody = body.attach(kj::mv(refcounted));
        }
        KJ_CASE_ONEOF(ws, kj::Own<WebSocket>) {
          // The only reason we need to attach the client to the WebSocket is because otherwise
          // the response headers will be deleted prematurely. Otherwise, the WebSocket has taken
          // ownership of the connection.
          //
          // TODO(perf): Maybe we could transfer ownership of the response headers specifically?
          response.webSocketOrBody = ws.attach(kj::mv(refcounted));
        }
      }
      return kj::mv(response);
    });
  }